

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnBrIfExpr(BinaryReaderIR *this,Index depth)

{
  Location local_98;
  Var local_78;
  unique_ptr<wabt::VarExpr<(wabt::ExprType)10>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)10>_>_>
  local_30;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_28;
  Index local_1c;
  BinaryReaderIR *pBStack_18;
  Index depth_local;
  BinaryReaderIR *this_local;
  
  local_1c = depth;
  pBStack_18 = this;
  Location::Location(&local_98);
  Var::Var(&local_78,depth,&local_98);
  MakeUnique<wabt::VarExpr<(wabt::ExprType)10>,wabt::Var>((wabt *)&local_30,&local_78);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::VarExpr<(wabt::ExprType)10>,std::default_delete<wabt::VarExpr<(wabt::ExprType)10>>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_28,&local_30);
  this_local._4_4_ = AppendExpr(this,&local_28);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_28);
  std::
  unique_ptr<wabt::VarExpr<(wabt::ExprType)10>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)10>_>_>
  ::~unique_ptr(&local_30);
  Var::~Var(&local_78);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnBrIfExpr(Index depth) {
  return AppendExpr(MakeUnique<BrIfExpr>(Var(depth)));
}